

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O2

void __thiscall OpenMD::SquareMatrix<double,_3>::SquareMatrix(SquareMatrix<double,_3> *this)

{
  uint i;
  long lVar1;
  uint j;
  long lVar2;
  
  RectMatrix<double,_3U,_3U>::RectMatrix(&this->super_RectMatrix<double,_3U,_3U>);
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      ((RectMatrix<double,_3U,_3U> *)*(double (*) [3])this)->data_[0][lVar2] = 0.0;
    }
    this = (SquareMatrix<double,_3> *)((long)this + 0x18);
  }
  return;
}

Assistant:

SquareMatrix() {
      for (unsigned int i = 0; i < Dim; i++)
        for (unsigned int j = 0; j < Dim; j++)
          this->data_[i][j] = 0.0;
    }